

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzrot::VariablesQbIncrementPosition(ChNodeFEAxyzrot *this,double step)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  undefined1 auVar8 [32];
  double dVar9;
  double dVar10;
  undefined8 in_XMM0_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  ChQuaternion<double> q;
  ChVector<double> newspeed;
  ChVector<double> newwel;
  ChQuaternion<double> local_160;
  undefined8 local_140;
  double local_130;
  double local_128;
  undefined8 uStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [32];
  ChVector<double> local_c8;
  ChVector<double> local_b0;
  undefined1 local_98 [16];
  double dStack_88;
  double dStack_80;
  undefined1 local_78 [32];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 local_38 [24];
  undefined1 auVar22 [32];
  
  local_e8._8_8_ = in_XMM0_Qb;
  local_e8._0_8_ = step;
  ChVariables::Get_qb((ChVectorRef *)&local_b0,(ChVariables *)&this->variables);
  local_160.m_data[1] = 1.48219693752374e-323;
  local_160.m_data[0] = local_b0.m_data[0];
  local_160.m_data[3] = (double)&local_b0;
  local_140 = 0;
  local_130 = local_b0.m_data[1];
  if (2 < (long)local_b0.m_data[1]) {
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_c8,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_160,(type *)0x0);
    ChVariables::Get_qb((ChVectorRef *)local_38,(ChVariables *)&this->variables);
    local_160.m_data[1] = 1.48219693752374e-323;
    local_160.m_data[0] = (double)(local_38._0_8_ + 0x18);
    local_160.m_data[3] = (double)local_38;
    local_140 = 3;
    local_130 = (double)local_38._8_8_;
    if (5 < (long)local_38._8_8_) {
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_b0,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)&local_160,(type *)0x0);
      dVar9 = *(double *)&this->field_0x30;
      dVar10 = *(double *)&this->field_0x28;
      *(double *)&(this->super_ChNodeFEAbase).field_0x20 =
           (double)local_e8._0_8_ * local_c8.m_data[0] +
           *(double *)&(this->super_ChNodeFEAbase).field_0x20;
      *(double *)&this->field_0x28 = (double)local_e8._0_8_ * local_c8.m_data[1] + dVar10;
      *(double *)&this->field_0x30 = (double)local_e8._0_8_ * local_c8.m_data[2] + dVar9;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_b0.m_data[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_b0.m_data[2];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)&this->field_0x70;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_b0.m_data[1] * *(double *)&this->field_0x78;
      auVar1 = vfmadd231sd_fma(auVar24,auVar11,auVar1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)&this->field_0x58;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_b0.m_data[1] * *(double *)&this->field_0x60;
      auVar2 = vfmadd231sd_fma(auVar17,auVar11,auVar2);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)&this->field_0x88;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_b0.m_data[1] * *(double *)&this->field_0x90;
      auVar3 = vfmadd231sd_fma(auVar14,auVar11,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)&this->field_0x80;
      auVar1 = vfmadd231sd_fma(auVar1,auVar20,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)&this->field_0x68;
      auVar2 = vfmadd231sd_fma(auVar2,auVar20,auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)&this->field_0x98;
      auVar3 = vfmadd231sd_fma(auVar3,auVar20,auVar6);
      dVar23 = auVar1._0_8_;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar23 * dVar23;
      auVar1 = vfmadd231sd_fma(auVar12,auVar2,auVar2);
      auVar1 = vfmadd231sd_fma(auVar1,auVar3,auVar3);
      auVar1 = vsqrtsd_avx(auVar1,auVar1);
      dVar9 = auVar1._0_8_;
      bVar7 = 2.2250738585072014e-308 <= dVar9;
      dVar10 = 1.0 / dVar9;
      local_128 = (double)((ulong)bVar7 * (long)(auVar2._0_8_ * dVar10) +
                          (ulong)!bVar7 * 0x3ff0000000000000);
      local_108 = (double)((ulong)bVar7 * (long)(dVar23 * dVar10));
      local_118 = (double)((ulong)bVar7 * (long)(auVar3._0_8_ * dVar10));
      uStack_110 = 0;
      local_78 = *(undefined1 (*) [32])&this->field_0x38;
      uStack_100 = 0;
      dVar9 = dVar9 * (double)local_e8._0_8_ * 0.5;
      uStack_120 = 0;
      _local_98 = vpermpd_avx2(local_78,1);
      local_e8 = vpermpd_avx2(*(undefined1 (*) [32])&this->field_0x48,0x15);
      local_f8 = *(undefined8 *)&this->field_0x40;
      local_58 = *(undefined8 *)&this->field_0x48;
      uStack_48 = 0;
      uStack_40 = 0;
      uStack_f0 = local_f8;
      uStack_50 = local_58;
      dVar10 = sin(dVar9);
      auVar13._0_8_ = cos(dVar9);
      auVar13._8_8_ = auVar13._0_8_;
      auVar13._16_8_ = auVar13._0_8_;
      auVar13._24_8_ = auVar13._0_8_;
      dVar9 = dVar10 * local_118;
      auVar26._0_8_ = -(dVar10 * local_128);
      auVar26._8_8_ = 0x8000000000000000;
      auVar21._8_8_ = dVar9;
      auVar21._0_8_ = dVar9;
      auVar22._16_8_ = dVar9;
      auVar22._0_16_ = auVar21;
      auVar22._24_8_ = dVar9;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar10 * local_128;
      auVar1 = vunpcklpd_avx(auVar26,auVar15);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar10 * local_108;
      auVar16._16_8_ = dVar10 * local_108;
      auVar16._0_16_ = auVar1;
      auVar16._24_8_ = 0;
      auVar1 = vunpcklpd_avx(auVar18,auVar21);
      auVar25._8_8_ = uStack_50;
      auVar25._0_8_ = local_58;
      auVar8 = vblendpd_avx(auVar16,auVar22,8);
      auVar27._0_8_ = auVar8._0_8_ * (double)local_98._0_8_;
      auVar27._8_8_ = auVar8._8_8_ * (double)local_98._8_8_;
      auVar27._16_8_ = auVar8._16_8_ * dStack_88;
      auVar27._24_8_ = auVar8._24_8_ * dStack_80;
      auVar25._24_8_ = uStack_f0;
      auVar25._16_8_ = local_f8;
      auVar19 = ZEXT1632(CONCAT88(auVar1._8_8_ ^ 0x8000000000000000,
                                  auVar1._0_8_ ^ 0x8000000000000000));
      auVar8 = vblendpd_avx(auVar19,auVar22,4);
      auVar8 = vpermpd_avx2(auVar8,0x24);
      auVar1 = vfmadd132pd_fma(auVar13,auVar27,local_78);
      auVar1 = vfmadd213pd_fma(auVar25,auVar8,ZEXT1632(auVar1));
      auVar8 = vpermi2pd_avx512vl(_DAT_009553a0,auVar16,auVar19);
      auVar1 = vfmadd132pd_fma(auVar8,ZEXT1632(auVar1),local_e8);
      local_160.m_data = (double  [4])ZEXT1632(auVar1);
      ChFrame<double>::SetRot((ChFrame<double> *)&(this->super_ChNodeFEAbase).field_0x18,&local_160)
      ;
      return;
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzrot::VariablesQbIncrementPosition(double step) {
    // if (!this->IsActive())
    //	return;

    // Updates position with incremental action of speed contained in the
    // 'qb' vector:  pos' = pos + dt * speed   , like in an Eulero step.

    ChVector<> newspeed(variables.Get_qb().segment(0, 3));
    ChVector<> newwel(variables.Get_qb().segment(3, 3));

    // ADVANCE POSITION: pos' = pos + dt * vel
    this->SetPos(this->GetPos() + newspeed * step);

    // ADVANCE ROTATION: rot' = [dt*wwel]%rot  (use quaternion for delta rotation)
    ChQuaternion<> mdeltarot;
    ChQuaternion<> moldrot = this->GetRot();
    ChVector<> newwel_abs = this->Amatrix * newwel;
    double mangle = newwel_abs.Length() * step;
    newwel_abs.Normalize();
    mdeltarot.Q_from_AngAxis(mangle, newwel_abs);
    ChQuaternion<> mnewrot = mdeltarot % moldrot;
    this->SetRot(mnewrot);
}